

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::bt_peer_connection::on_reject_request(bt_peer_connection *this,int received)

{
  crypto_receive_buffer *this_00;
  bool bVar1;
  int iVar2;
  span<const_char> sVar3;
  char *ptr;
  peer_request r;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  if (((this->super_peer_connection).field_0x889 & 4) != 0) {
    this_00 = &this->m_recv_buffer;
    iVar2 = crypto_receive_buffer::packet_size(this_00);
    if (iVar2 == 0xd) {
      bVar1 = crypto_receive_buffer::packet_finished(this_00);
      if (!bVar1) {
        return;
      }
      sVar3 = crypto_receive_buffer::get(this_00);
      ptr = sVar3.m_ptr + 1;
      r.piece.m_val = read_impl<int,char_const*>(&ptr);
      r.start = read_impl<int,char_const*>(&ptr);
      r.length = read_impl<int,char_const*>(&ptr);
      peer_connection::incoming_reject_request(&this->super_peer_connection,&r);
      return;
    }
  }
  boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
            ((error_code *)&r,invalid_reject,(type *)0x0);
  (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
            (this,(error_code *)&r,1,2);
  return;
}

Assistant:

void bt_peer_connection::on_reject_request(int received)
	{
		INVARIANT_CHECK;

		received_bytes(0, received);
		if (!m_supports_fast || m_recv_buffer.packet_size() != 13)
		{
			disconnect(errors::invalid_reject, operation_t::bittorrent, peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		span<char const> recv_buffer = m_recv_buffer.get();

		peer_request r;
		const char* ptr = recv_buffer.data() + 1;
		r.piece = piece_index_t(aux::read_int32(ptr));
		r.start = aux::read_int32(ptr);
		r.length = aux::read_int32(ptr);

		incoming_reject_request(r);
	}